

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall
jaegertracing::net::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int iVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  undefined4 in_register_00000034;
  socklen_t local_9c;
  int clientHandle;
  socklen_t addrLen;
  sockaddr_storage addrStorage;
  Socket *this_local;
  Socket *clientSocket;
  
  addrStorage.__ss_align = CONCAT44(in_register_00000034,__fd);
  local_9c = 0x80;
  iVar2 = ::accept(*(int *)(addrStorage.__ss_align + 4),(sockaddr *)&clientHandle,&local_9c);
  bVar1 = isHandleInvalid(iVar2);
  if (bVar1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,iVar2,__ecat,"Failed to accept on socket");
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  Socket(this);
  this->_handle = iVar2;
  iVar2 = 10;
  if (local_9c == 0x10) {
    iVar2 = 2;
  }
  this->_family = iVar2;
  this->_type = 1;
  return (int)this;
}

Assistant:

Socket accept()
    {
        ::sockaddr_storage addrStorage;
        ::socklen_t addrLen = sizeof(addrStorage);
        const auto clientHandle = ::accept(
            _handle, reinterpret_cast<::sockaddr*>(&addrStorage), &addrLen);

        if (isHandleInvalid(clientHandle)) {
            throw std::system_error(
                errno, std::system_category(), "Failed to accept on socket");
        }

        Socket clientSocket;
        clientSocket._handle = clientHandle;
        clientSocket._family =
            (addrLen == sizeof(::sockaddr_in)) ? AF_INET : AF_INET6;
        clientSocket._type = SOCK_STREAM;
        return clientSocket;
    }